

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall cmFileCopier::SetPermissions(cmFileCopier *this,char *toFile,mode_t permissions)

{
  cmCommand *this_00;
  bool bVar1;
  ostream *poVar2;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  mode_t permissions_local;
  char *toFile_local;
  cmFileCopier *this_local;
  
  if ((permissions != 0) && (bVar1 = cmsys::SystemTools::SetPermissions(toFile,permissions), !bVar1)
     ) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = std::operator<<((ostream *)local_1a0,this->Name);
    poVar2 = std::operator<<(poVar2," cannot set permissions on \"");
    poVar2 = std::operator<<(poVar2,toFile);
    std::operator<<(poVar2,"\"");
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(this_00,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    return false;
  }
  return true;
}

Assistant:

bool SetPermissions(const char* toFile, mode_t permissions)
    {
    if(permissions && !cmSystemTools::SetPermissions(toFile, permissions))
      {
      std::ostringstream e;
      e << this->Name << " cannot set permissions on \"" << toFile << "\"";
      this->FileCommand->SetError(e.str());
      return false;
      }
    return true;
    }